

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result wabt::ReadBinaryObjdump
                 (uint8_t *data,size_t size,ObjdumpOptions *options,ObjdumpState *state)

{
  Result RVar1;
  pointer *__ptr;
  ReadBinaryOptions read_options;
  BinaryReaderObjdumpPrepass reader;
  Features features;
  ReadBinaryOptions local_1b8;
  BinaryReaderDelegate local_190;
  ObjdumpOptions *local_180;
  ObjdumpState *local_178;
  uint8_t *local_170;
  size_t local_168;
  undefined1 local_160;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  void *local_e8;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 uStack_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined4 local_a8;
  long *local_a0;
  long *local_98;
  undefined7 uStack_90;
  undefined1 uStack_89;
  undefined7 uStack_88;
  undefined1 uStack_81;
  undefined8 uStack_80;
  void *local_78;
  undefined2 uStack_70;
  undefined6 uStack_6e;
  undefined2 local_68;
  undefined6 uStack_66;
  undefined2 uStack_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  Features local_42;
  
  local_42.exceptions_enabled_ = false;
  local_42.mutable_globals_enabled_ = true;
  local_42.sat_float_to_int_enabled_ = true;
  local_42.sign_extension_enabled_ = true;
  local_42.simd_enabled_ = true;
  local_42.threads_enabled_ = false;
  local_42.function_references_enabled_ = false;
  local_42.multi_value_enabled_ = true;
  local_42.tail_call_enabled_ = false;
  local_42.bulk_memory_enabled_ = true;
  local_42.reference_types_enabled_ = true;
  local_42.annotations_enabled_ = false;
  local_42.code_metadata_enabled_ = false;
  local_42.gc_enabled_ = false;
  local_42.memory64_enabled_ = false;
  local_42.multi_memory_enabled_ = false;
  local_42.extended_const_enabled_ = false;
  local_42.relaxed_simd_enabled_ = false;
  Features::EnableAll(&local_42);
  local_1b8.log_stream = options->log_stream;
  local_1b8.features.extended_const_enabled_ = local_42.extended_const_enabled_;
  local_1b8.features.relaxed_simd_enabled_ = local_42.relaxed_simd_enabled_;
  local_1b8.features.mutable_globals_enabled_ = local_42.mutable_globals_enabled_;
  local_1b8.features.sat_float_to_int_enabled_ = local_42.sat_float_to_int_enabled_;
  local_1b8.features.sign_extension_enabled_ = local_42.sign_extension_enabled_;
  local_1b8.features.simd_enabled_ = local_42.simd_enabled_;
  local_1b8.features.threads_enabled_ = local_42.threads_enabled_;
  local_1b8.features.function_references_enabled_ = local_42.function_references_enabled_;
  local_1b8.features.multi_value_enabled_ = local_42.multi_value_enabled_;
  local_1b8.features.exceptions_enabled_ = local_42.exceptions_enabled_;
  local_1b8.features.bulk_memory_enabled_ = local_42.bulk_memory_enabled_;
  local_1b8.features.reference_types_enabled_ = local_42.reference_types_enabled_;
  local_1b8.features.tail_call_enabled_ = local_42.tail_call_enabled_;
  local_1b8.features.annotations_enabled_ = local_42.annotations_enabled_;
  local_1b8.features.code_metadata_enabled_ = local_42.code_metadata_enabled_;
  local_1b8.features.gc_enabled_ = local_42.gc_enabled_;
  local_1b8.features.memory64_enabled_ = local_42.memory64_enabled_;
  local_1b8.features.multi_memory_enabled_ = local_42.multi_memory_enabled_;
  local_1b8.read_debug_names = true;
  local_1b8.stop_on_first_error = false;
  local_1b8.fail_on_custom_section_error = false;
  local_1b8.skip_function_bodies = false;
  local_180 = options;
  local_178 = state;
  local_170 = data;
  local_168 = size;
  if (options->mode == Disassemble) {
    local_190.state = (State *)0x0;
    local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001417f0;
    local_160 = 0;
    local_15c = 0xffffffff;
    local_e8 = (void *)0x0;
    uStack_e0 = 0;
    uStack_df = 0;
    local_d8 = 0;
    uStack_d7 = 0;
    uStack_d0 = 0;
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = 0;
    local_c8 = &local_b8;
    FileStream::CreateStderr();
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_00141ee0;
    local_98 = (long *)0x0;
    uStack_90 = 0;
    uStack_89 = 0;
    uStack_88 = 0;
    uStack_81 = 0;
    uStack_80 = 0;
    local_78 = (void *)((ulong)local_78 & 0xffffffffffff0000);
    RVar1 = ReadBinary(data,size,&local_190,&local_1b8);
    local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001417f0;
    if (local_a0 != (long *)0x0) {
      (**(code **)(*local_a0 + 8))();
    }
    local_a0 = (long *)0x0;
    if (local_c8 == &local_b8) goto LAB_00112b97;
  }
  else {
    if (options->mode == Prepass) {
      local_1b8.read_debug_names = true;
      local_1b8.stop_on_first_error = false;
      local_1b8.fail_on_custom_section_error = false;
      local_1b8.skip_function_bodies = true;
      local_c8 = &local_b8;
      local_190.state = (State *)0x0;
      local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001417f0;
      local_160 = 0;
      local_15c = 0xffffffff;
      local_e8 = (void *)0x0;
      uStack_e0 = 0;
      uStack_df = 0;
      local_d8 = 0;
      uStack_d7 = 0;
      uStack_d0 = 0;
      local_c0 = 0;
      local_b8 = 0;
      local_a8 = 0;
      FileStream::CreateStderr();
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      local_148 = 0;
      uStack_140 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001410d0;
      RVar1 = ReadBinary(data,size,&local_190,&local_1b8);
    }
    else {
      local_1b8.read_debug_names = true;
      local_1b8.stop_on_first_error = false;
      local_1b8.fail_on_custom_section_error = false;
      local_1b8.skip_function_bodies = true;
      local_c8 = &local_b8;
      local_190.state = (State *)0x0;
      local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001417f0;
      local_160 = 0;
      local_15c = 0xffffffff;
      local_e8 = (void *)0x0;
      uStack_e0 = 0;
      uStack_df = 0;
      local_d8 = 0;
      uStack_d7 = 0;
      uStack_d0 = 0;
      local_c0 = 0;
      local_b8 = 0;
      local_a8 = 0;
      FileStream::CreateStderr();
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      local_148 = 0;
      uStack_140 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_001425e8;
      FileStream::CreateStdout();
      uStack_88 = 0;
      uStack_90 = 0;
      uStack_89 = 0;
      local_78 = (void *)0x0;
      uStack_70 = 0;
      uStack_6e = 0;
      local_68 = 0;
      uStack_66 = 0;
      uStack_60 = 0;
      local_5c = 0;
      uStack_54 = 0;
      local_4c = 0;
      RVar1 = ReadBinary(data,size,&local_190,&local_1b8);
      local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_001425e8;
      if (local_78 != (void *)0x0) {
        operator_delete(local_78,CONCAT62(uStack_66,local_68) - (long)local_78);
      }
      if (local_98 != (long *)0x0) {
        (**(code **)(*local_98 + 8))();
      }
      local_98 = (long *)0x0;
    }
    local_190._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001417f0;
    if (local_a0 != (long *)0x0) {
      (**(code **)(*local_a0 + 8))();
    }
    local_a0 = (long *)0x0;
    if (local_c8 == &local_b8) goto LAB_00112b97;
  }
  local_a0 = (long *)0x0;
  operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
LAB_00112b97:
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) - (long)local_e8);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryObjdump(const uint8_t* data,
                         size_t size,
                         ObjdumpOptions* options,
                         ObjdumpState* state) {
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = false;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions read_options(features, options->log_stream, kReadDebugNames,
                                 kStopOnFirstError, kFailOnCustomSectionError);

  switch (options->mode) {
    case ObjdumpMode::Prepass: {
      read_options.skip_function_bodies = true;
      BinaryReaderObjdumpPrepass reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    case ObjdumpMode::Disassemble: {
      BinaryReaderObjdumpDisassemble reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    default: {
      read_options.skip_function_bodies = true;
      BinaryReaderObjdump reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
  }
}